

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O0

void sys_rename(Process *proc,Args *args)

{
  pid_t pid;
  int64_t iVar1;
  uint64_t uVar2;
  string local_e8;
  path local_c8;
  undefined1 local_a8 [8];
  path dst;
  string local_78;
  path local_58;
  undefined1 local_38 [8];
  path src;
  Args *args_local;
  Process *proc_local;
  
  iVar1 = args->PID;
  src.m_pathname.field_2._8_8_ = args;
  uVar2 = Args::operator[](args,0);
  ReadString_abi_cxx11_(&local_78,(pid_t)iVar1,uVar2);
  boost::filesystem::path::path(&local_58,&local_78);
  Process::Normalise((path *)local_38,proc,&local_58);
  boost::filesystem::path::~path(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  pid = *(pid_t *)src.m_pathname.field_2._8_8_;
  uVar2 = Args::operator[]((Args *)src.m_pathname.field_2._8_8_,1);
  ReadString_abi_cxx11_(&local_e8,pid,uVar2);
  boost::filesystem::path::path(&local_c8,&local_e8);
  Process::Normalise((path *)local_a8,proc,&local_c8);
  boost::filesystem::path::~path(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (-1 < *(long *)(src.m_pathname.field_2._8_8_ + 8)) {
    Process::Rename(proc,(path *)local_38,(path *)local_a8);
  }
  boost::filesystem::path::~path((path *)local_a8);
  boost::filesystem::path::~path((path *)local_38);
  return;
}

Assistant:

static void sys_rename(Process *proc, const Args &args)
{
  const fs::path src = proc->Normalise(ReadString(args.PID, args[0]));
  const fs::path dst = proc->Normalise(ReadString(args.PID, args[1]));

  if (args.Return >= 0) {
    proc->Rename(src, dst);
  }
}